

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sounds.c
# Opt level: O2

char * growl_sound(monst *mtmp)

{
  ulong uVar1;
  
  uVar1 = (ulong)mtmp->data->msound;
  if (uVar1 < 0xc) {
    return &DAT_002ba048 + *(int *)(&DAT_002ba048 + uVar1 * 4);
  }
  return "scream";
}

Assistant:

const char *growl_sound(struct monst *mtmp)
{
	const char *ret;

	switch (mtmp->data->msound) {
	case MS_MEW:
	case MS_HISS:
	    ret = "hiss";
	    break;
	case MS_BARK:
	case MS_GROWL:
	    ret = "growl";
	    break;
	case MS_ROAR:
	    ret = "roar";
	    break;
	case MS_BUZZ:
	    ret = "buzz";
	    break;
	case MS_SQEEK:
	    ret = "squeal";
	    break;
	case MS_SQAWK:
	    ret = "screech";
	    break;
	case MS_NEIGH:
	    ret = "neigh";
	    break;
	case MS_WAIL:
	    ret = "wail";
	    break;
	case MS_SILENT:
		ret = "commotion";
		break;
	default:
		ret = "scream";
	}
	return ret;
}